

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile-time-kalman-filter-base.hxx
# Opt level: O2

void __thiscall
stateObservation::compileTime::KalmanFilterBase<4U,_3U,_0U>::reset
          (KalmanFilterBase<4U,_3U,_0U> *this)

{
  ObserverBase<4U,_3U,_0U>::reset((ObserverBase<4U,_3U,_0U> *)this);
  (this->a_).k_ = 0;
  (this->a_).isSet_ = false;
  (this->c_).k_ = 0;
  (this->c_).isSet_ = false;
  (this->q_).k_ = 0;
  (this->q_).isSet_ = false;
  (this->r_).k_ = 0;
  (this->r_).isSet_ = false;
  (this->p_).k_ = 0;
  (this->p_).isSet_ = false;
  return;
}

Assistant:

void KalmanFilterBase<n,m,p>::reset()
{
    ZeroDelayObserver<n,m,p>::reset();

    a_.reset();
    c_.reset();
    a_.reset();
    c_.reset();
    q_.reset();
    r_.reset();
    p_.reset();
}